

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

s32 __thiscall
irr::video::CNullDriver::addMaterialRenderer
          (CNullDriver *this,IMaterialRenderer *renderer,char *name)

{
  u32 uVar1;
  long in_RDX;
  long *in_RSI;
  array<irr::video::CNullDriver::SMaterialRenderer> *in_RDI;
  SMaterialRenderer r;
  SMaterialRenderer *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffc0;
  string<char> *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  if (in_RSI == (long *)0x0) {
    local_4 = -1;
  }
  else {
    SMaterialRenderer::SMaterialRenderer((SMaterialRenderer *)0x30cf8c);
    core::string<char>::operator=(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    if (in_RDX == 0) {
      uVar1 = core::array<irr::video::CNullDriver::SMaterialRenderer>::size
                        ((array<irr::video::CNullDriver::SMaterialRenderer> *)0x30cfbe);
      if (uVar1 < 5) {
        core::array<irr::video::CNullDriver::SMaterialRenderer>::size
                  ((array<irr::video::CNullDriver::SMaterialRenderer> *)0x30cfd4);
        core::string<char>::operator=(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      }
    }
    core::array<irr::video::CNullDriver::SMaterialRenderer>::push_back
              (in_RDI,in_stack_ffffffffffffffa8);
    IReferenceCounted::grab((IReferenceCounted *)((long)in_RSI + *(long *)(*in_RSI + -0x18)));
    uVar1 = core::array<irr::video::CNullDriver::SMaterialRenderer>::size
                      ((array<irr::video::CNullDriver::SMaterialRenderer> *)0x30d025);
    local_4 = uVar1 - 1;
    SMaterialRenderer::~SMaterialRenderer((SMaterialRenderer *)0x30d036);
  }
  return local_4;
}

Assistant:

s32 CNullDriver::addMaterialRenderer(IMaterialRenderer *renderer, const char *name)
{
	if (!renderer)
		return -1;

	SMaterialRenderer r;
	r.Renderer = renderer;
	r.Name = name;

	if (name == 0 && MaterialRenderers.size() < numBuiltInMaterials) {
		// set name of built in renderer so that we don't have to implement name
		// setting in all available renderers.
		r.Name = sBuiltInMaterialTypeNames[MaterialRenderers.size()];
	}

	MaterialRenderers.push_back(r);
	renderer->grab();

	return MaterialRenderers.size() - 1;
}